

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Noise::run(Sms_Noise *this,blip_time_t time,blip_time_t end_time)

{
  int iVar1;
  uint uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int changed;
  int period;
  int delta_1;
  uint shifter;
  Blip_Buffer *output;
  int delta;
  int amp;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  undefined4 local_c;
  
  local_14 = *(int *)(in_RDI + 0x34);
  if ((*(uint *)(in_RDI + 0x40) & 1) != 0) {
    local_14 = -local_14;
  }
  if (local_14 != *(int *)(in_RDI + 0x30)) {
    *(int *)(in_RDI + 0x30) = local_14;
    Blip_Synth<8,_1>::offset
              ((Blip_Synth<8,_1> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x818e6f);
  }
  local_c = *(int *)(in_RDI + 0x2c) + in_ESI;
  if (*(int *)(in_RDI + 0x34) == 0) {
    local_c = in_EDX;
  }
  if (local_c < in_EDX) {
    local_24 = *(uint *)(in_RDI + 0x40);
    local_28 = local_14 << 1;
    iVar1 = **(int **)(in_RDI + 0x38) << 1;
    if (iVar1 == 0) {
      iVar1 = 0x10;
    }
    do {
      uVar2 = local_24 + 1;
      local_24 = *(uint *)(in_RDI + 0x44) & -(local_24 & 1) ^ local_24 >> 1;
      if ((uVar2 & 2) != 0) {
        local_28 = -local_28;
        Blip_Synth<8,_1>::offset_inline
                  ((Blip_Synth<8,_1> *)CONCAT44(iVar1,uVar2),(blip_time_t)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,(Blip_Buffer *)0x818f30);
      }
      local_c = iVar1 + local_c;
    } while (local_c < in_EDX);
    *(uint *)(in_RDI + 0x40) = local_24;
    *(int *)(in_RDI + 0x30) = local_28 >> 1;
  }
  *(int *)(in_RDI + 0x2c) = local_c - in_EDX;
  return;
}

Assistant:

void Sms_Noise::run( blip_time_t time, blip_time_t end_time )
{
	int amp = volume;
	if ( shifter & 1 )
		amp = -amp;
	
	{
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth.offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !volume )
		time = end_time;
	
	if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		unsigned shifter = this->shifter;
		int delta = amp * 2;
		int period = *this->period * 2;
		if ( !period )
			period = 16;
		
		do
		{
			int changed = shifter + 1;
			shifter = (feedback & (unsigned)-(signed)(shifter & 1)) ^ (shifter >> 1);
			if ( changed & 2 ) // true if bits 0 and 1 differ
			{
				delta = -delta;
				synth.offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->shifter = shifter;
		this->last_amp = delta >> 1;
	}
	delay = time - end_time;
}